

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O3

int main(void)

{
  ushort uVar1;
  uint16_t uVar2;
  uint *puVar3;
  uint uVar4;
  run_container_t *prVar5;
  ulong uVar6;
  rle16_t *prVar7;
  undefined4 extraout_var;
  run_container_t *prVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  run_container_t *prVar13;
  long lVar14;
  int card;
  int card_1;
  int iVar15;
  int32_t iVar16;
  char *pcVar17;
  int x_1;
  int iVar18;
  int iVar19;
  int i_1;
  uint uVar20;
  int x;
  int iVar21;
  void *pvVar22;
  int i;
  int iVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  timespec ts;
  timespec local_78;
  run_container_t *local_68;
  run_container_t *local_60;
  ulong local_58;
  run_container_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  puVar3 = (uint *)cpuid_Version_info(1);
  uVar12 = (ulong)puVar3[3];
  uVar4 = *puVar3 >> 4;
  if (uVar4 < 0x406c) {
    if (uVar4 < 0x2065) {
      if (uVar4 < 0x266) {
        if (uVar4 < 0x6d) {
          uVar12 = (ulong)(uVar4 - 99);
          if (uVar4 - 99 < 2) {
            pcVar17 = "Prescott";
            goto LAB_00101557;
          }
          if (uVar4 == 0x66) {
            pcVar17 = "Presler";
            goto LAB_00101557;
          }
        }
        else {
          if (uVar4 == 0x6d) {
            pcVar17 = "Dothan";
            goto LAB_00101557;
          }
          if (uVar4 == 0x6f) goto switchD_00101304_caseD_0;
          if (uVar4 == 0x16c) {
            pcVar17 = "Pineview";
            goto LAB_00101557;
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar4 - 0x1066);
        if (uVar4 - 0x1066 < 9) {
          uVar12 = (long)&switchD_00101304::switchdataD_00105014 +
                   (long)(int)(&switchD_00101304::switchdataD_00105014)[uVar6];
          switch(uVar6) {
          case 0:
switchD_00101304_caseD_0:
            pcVar17 = "Merom";
            goto LAB_00101557;
          case 1:
          case 7:
            pcVar17 = "Penryn";
            goto LAB_00101557;
          case 4:
          case 8:
switchD_00101304_caseD_4:
            pcVar17 = "Nehalem";
            goto LAB_00101557;
          }
        }
        else {
          uVar12 = uVar6;
          if (uVar4 == 0x266) {
            pcVar17 = "Lincroft";
            goto LAB_00101557;
          }
          if (uVar4 == 0x366) {
            pcVar17 = "Cedarview";
            goto LAB_00101557;
          }
        }
      }
    }
    else if (uVar4 < 0x306a) {
      uVar4 = uVar4 - 0x2065;
      if (uVar4 < 0xb) {
        uVar12 = 0x481;
        if ((0x481U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar17 = "Westmere";
          goto LAB_00101557;
        }
        uVar12 = 0x120;
        if ((0x120U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar17 = "SandyBridge";
          goto LAB_00101557;
        }
        if (uVar4 == 9) goto switchD_00101304_caseD_4;
      }
    }
    else if (uVar4 < 0x306d) {
      if (uVar4 == 0x306a) {
        pcVar17 = "IvyBridge";
        goto LAB_00101557;
      }
      if (uVar4 == 0x306c) {
        pcVar17 = "Haswell";
        goto LAB_00101557;
      }
    }
    else {
      if (uVar4 == 0x306d) {
        pcVar17 = "Broadwell";
        goto LAB_00101557;
      }
      if (uVar4 == 0x30f1) goto LAB_001014ea;
    }
  }
  else if (uVar4 < 0x9067) {
    if (uVar4 < 0x706a) {
      if (uVar4 < 0x606a) {
        if (uVar4 == 0x406c) {
          pcVar17 = "CherryTrail";
          goto LAB_00101557;
        }
        if (uVar4 == 0x506c) goto LAB_0010148a;
        if (uVar4 == 0x506e) {
          pcVar17 = "Skylake";
          goto LAB_00101557;
        }
      }
      else {
        if (uVar4 == 0x606a) {
LAB_00101496:
          pcVar17 = "Icelake";
          goto LAB_00101557;
        }
        if ((uVar4 == 0x60f0) || (uVar4 == 0x60f8)) {
LAB_001014ea:
          pcVar17 = "Zen2";
          goto LAB_00101557;
        }
      }
    }
    else if (uVar4 < 0x806c) {
      if (uVar4 == 0x706a) {
LAB_0010148a:
        pcVar17 = "Goldmont";
        goto LAB_00101557;
      }
      if (uVar4 == 0x706e) goto LAB_00101496;
      if (uVar4 == 0x70f1) goto LAB_001014ea;
    }
    else {
      uVar12 = (ulong)(uVar4 - 0x806c);
      if (uVar4 - 0x806c < 2) {
        pcVar17 = "TigerLake";
        goto LAB_00101557;
      }
      if (uVar4 == 0x806e) {
LAB_001014fa:
        pcVar17 = "Kabylake";
        goto LAB_00101557;
      }
    }
  }
  else if (uVar4 < 0xa067) {
    if (uVar4 < 0x90f0) {
      if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
        pcVar17 = "Alderlake";
        goto LAB_00101557;
      }
      if (uVar4 == 0x906e) goto LAB_001014fa;
    }
    else {
      uVar12 = (ulong)(uVar4 - 0xa065);
      if (uVar4 - 0xa065 < 2) {
        pcVar17 = "Cometlake";
        goto LAB_00101557;
      }
      if (uVar4 == 0x90f0) goto LAB_001014ea;
    }
  }
  else if (uVar4 < 0x40f40) {
    if (uVar4 == 0xa067) {
      pcVar17 = "Rocketlake";
      goto LAB_00101557;
    }
    if (uVar4 == 0xb067) {
      pcVar17 = "Raptorlake";
      goto LAB_00101557;
    }
    if (uVar4 == 0x20f10) goto LAB_001014a2;
  }
  else {
    if (uVar4 == 0x40f40) {
      pcVar17 = "Zen3+";
      goto LAB_00101557;
    }
    if (uVar4 == 0x50f00) {
LAB_001014a2:
      pcVar17 = "Zen3";
      goto LAB_00101557;
    }
    if (uVar4 == 0x60f10) {
      pcVar17 = "Zen4";
      goto LAB_00101557;
    }
  }
  pcVar17 = "unknown";
LAB_00101557:
  iVar23 = 0;
  printf("x64 processor:  %s\t",pcVar17,(ulong)puVar3[2],uVar12);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar24 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar24 + 0xc) != '@') {
    lVar24 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar24 + 0xc),
           (ulong)*(uint *)(lVar24 + 8),(ulong)*(uint *)(lVar24 + 0xc));
  }
  puts("run container benchmarks");
  prVar5 = run_container_create();
  printf("%s: ","add_test(B)");
  fflush((FILE *)0x0);
  uVar12 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_78);
    lVar24 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    uVar4 = 0xfffffffd;
    do {
      uVar4 = uVar4 + 3;
      run_container_add(prVar5,(uint16_t)uVar4);
    } while (uVar4 < 0xfffd);
    clock_gettime(3,&local_78);
    uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar24) * 1000000000 +
            (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
    if (uVar6 < uVar12) {
      uVar12 = uVar6;
    }
    iVar23 = iVar23 + 1;
  } while (iVar23 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar12 * 0.00048828125));
  putchar(10);
  iVar21 = 0;
  fflush((FILE *)0x0);
  prVar7 = prVar5->runs;
  iVar23 = 0;
  do {
    if (prVar5->n_runs < 1) {
LAB_00101705:
      iVar15 = 0;
    }
    else {
      uVar12 = 0;
      iVar15 = prVar5->n_runs + -1;
      do {
        uVar4 = (uint)(iVar15 + (int)uVar12) >> 1;
        if (prVar7[uVar4].value < (ushort)iVar21) {
          uVar12 = (ulong)(uVar4 + 1);
        }
        else {
          if (prVar7[uVar4].value <= (ushort)iVar21) {
            iVar15 = 1;
            goto LAB_0010170e;
          }
          iVar15 = uVar4 - 1;
        }
      } while ((int)uVar12 <= iVar15);
      if (((int)uVar12 == 0) ||
         (iVar15 = 1,
         (int)(uint)prVar7[uVar12 - 1].length < (int)(iVar21 - (uint)prVar7[uVar12 - 1].value)))
      goto LAB_00101705;
    }
LAB_0010170e:
    iVar23 = iVar23 + iVar15;
    iVar21 = iVar21 + 1;
    if (iVar21 == 0x10000) {
      bVar25 = false;
      printf("%s: ","contains_test(B)");
      fflush((FILE *)0x0);
      uVar12 = 0xffffffffffffffff;
      iVar21 = 0;
      do {
        clock_gettime(3,&local_78);
        local_60 = (run_container_t *)CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
        local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
        prVar7 = prVar5->runs;
        iVar18 = 0;
        iVar15 = 0;
        do {
          if (prVar5->n_runs < 1) {
LAB_001017c7:
            iVar19 = 0;
          }
          else {
            uVar6 = 0;
            iVar19 = prVar5->n_runs + -1;
            do {
              uVar4 = (uint)(iVar19 + (int)uVar6) >> 1;
              if (prVar7[uVar4].value < (ushort)iVar18) {
                uVar6 = (ulong)(uVar4 + 1);
              }
              else {
                if (prVar7[uVar4].value <= (ushort)iVar18) {
                  iVar19 = 1;
                  goto LAB_001017d2;
                }
                iVar19 = uVar4 - 1;
              }
            } while ((int)uVar6 <= iVar19);
            if (((int)uVar6 == 0) ||
               (iVar19 = 1,
               (int)(uint)prVar7[uVar6 - 1].length < (int)(iVar18 - (uint)prVar7[uVar6 - 1].value)))
            goto LAB_001017c7;
          }
LAB_001017d2:
          iVar15 = iVar15 + iVar19;
          iVar18 = iVar18 + 1;
        } while (iVar18 != 0x10000);
        if (iVar15 != iVar23) {
          bVar25 = true;
        }
        clock_gettime(3,&local_78);
        uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - (long)local_60) * 1000000000
                + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
        if (uVar6 < uVar12) {
          uVar12 = uVar6;
        }
        iVar21 = iVar21 + 1;
        if (iVar21 == 500) {
          printf(" %.2f cycles per operation",(double)((float)uVar12 * 1.5258789e-05));
          if (bVar25) {
            printf(" [ERROR]");
          }
          putchar(10);
          pvVar22 = (void *)0x0;
          fflush((FILE *)0x0);
          printf("%s: ","remove_test(B)");
          fflush((FILE *)0x0);
          prVar13 = (run_container_t *)0xffffffffffffffff;
          do {
            local_60 = (run_container_t *)pvVar22;
            local_50 = prVar13;
            clock_gettime(3,&local_78);
            local_48 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
            local_58 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
            iVar16 = prVar5->n_runs;
            uVar4 = 0;
            do {
              if (0 < iVar16) {
                prVar7 = prVar5->runs;
                iVar23 = iVar16 + -1;
                uVar20 = 0;
                do {
                  uVar10 = iVar23 + uVar20 >> 1;
                  uVar1 = prVar7[uVar10].value;
                  if (uVar1 < (ushort)uVar4) {
                    uVar20 = uVar10 + 1;
                  }
                  else {
                    if (uVar1 <= (ushort)uVar4) {
                      uVar2 = prVar7[uVar10].length;
                      if (uVar2 == 0) {
                        memmove(prVar7 + (ushort)uVar10,prVar7 + (ulong)(ushort)uVar10 + 1,
                                (long)(int)(iVar16 + ~(uVar10 & 0xffff)) << 2);
                        iVar16 = prVar5->n_runs + -1;
                        prVar5->n_runs = iVar16;
                      }
                      else {
                        prVar7[uVar10].value = uVar1 + 1;
                        prVar7[uVar10].length = uVar2 - 1;
                      }
                      goto LAB_001019fc;
                    }
                    iVar23 = uVar10 - 1;
                  }
                } while ((int)uVar20 <= iVar23);
                if (uVar20 != 0) {
                  uVar10 = uVar4 - prVar7[(ulong)uVar20 - 1].value;
                  uVar1 = prVar7[(ulong)uVar20 - 1].length;
                  if ((int)uVar10 < (int)(uint)uVar1) {
                    prVar7[(ulong)uVar20 - 1].length = (ushort)uVar10 - 1;
                    if (prVar5->capacity <= iVar16) {
                      run_container_grow(prVar5,iVar16 + 1,true);
                      iVar16 = prVar5->n_runs;
                      prVar7 = prVar5->runs;
                    }
                    local_68 = (run_container_t *)CONCAT44(local_68._4_4_,uVar4 + 1);
                    uVar11 = uVar20 & 0xffff;
                    memmove(prVar7 + (ulong)uVar11 + 1,prVar7 + uVar11,
                            (long)(int)(iVar16 - uVar11) << 2);
                    iVar16 = prVar5->n_runs + 1;
                    prVar5->n_runs = iVar16;
                    prVar7 = prVar5->runs;
                    prVar7[uVar20].value = (uint16_t)local_68;
                    prVar7[uVar20].length = uVar1 + ~(ushort)uVar10;
                  }
                  else if (uVar10 == uVar1) {
                    prVar7[(ulong)uVar20 - 1].length = uVar1 - 1;
                  }
                }
              }
LAB_001019fc:
              bVar25 = uVar4 < 0xfffd;
              uVar4 = uVar4 + 3;
            } while (bVar25);
            clock_gettime(3,&local_78);
            uVar12 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - local_48) * 1000000000
                     + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - local_58);
            prVar13 = local_50;
            if (uVar12 < local_50) {
              prVar13 = (run_container_t *)uVar12;
            }
            uVar4 = (int)local_60 + 1;
            pvVar22 = (void *)(ulong)uVar4;
            if (uVar4 == 500) {
              printf(" %.2f cycles per operation",(double)((float)prVar13 / 21845.0));
              putchar(10);
              fflush((FILE *)0x0);
              run_container_free(prVar5);
              uVar12 = 0x20;
              do {
                prVar5 = run_container_create();
                local_50 = (run_container_t *)uVar12;
                do {
                  uVar4 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
                  bVar9 = (byte)(pcg32_global_0 >> 0x3b);
                  pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
                  run_container_add(prVar5,(ushort)(uVar4 >> bVar9) |
                                           (ushort)(uVar4 << 0x20 - bVar9));
                  uVar4 = (int)uVar12 - 1;
                  uVar12 = (ulong)uVar4;
                } while (uVar4 != 0);
                uVar4 = run_container_cardinality(prVar5);
                bVar25 = false;
                printf("\n number of values in container = %d\n",(ulong)uVar4);
                iVar23 = run_container_cardinality(prVar5);
                local_68 = (run_container_t *)CONCAT44(extraout_var,iVar23);
                local_58 = (ulong)iVar23;
                local_60 = (run_container_t *)malloc(local_58 * 4);
                printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
                fflush((FILE *)0x0);
                iVar23 = 500;
                uVar12 = 0xffffffffffffffff;
                do {
                  clock_gettime(3,&local_78);
                  lVar24 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                  lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                  iVar21 = run_container_to_uint32_array(local_60,prVar5,0x4d2);
                  if (iVar21 != (int)local_68) {
                    bVar25 = true;
                  }
                  clock_gettime(3,&local_78);
                  prVar13 = local_60;
                  uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar24) *
                          1000000000 +
                          (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
                  if (uVar12 <= uVar6) {
                    uVar6 = uVar12;
                  }
                  iVar23 = iVar23 + -1;
                  uVar12 = uVar6;
                } while (iVar23 != 0);
                if ((long)local_58 < 0) {
                  fVar26 = (float)((ulong)((uint)local_68 & 1) | local_58 >> 1);
                  fVar26 = fVar26 + fVar26;
                }
                else {
                  fVar26 = (float)(int)(uint)local_68;
                }
                printf(" %.2f cycles per operation",(double)((float)uVar6 / fVar26));
                if (bVar25) {
                  printf(" [ERROR]");
                }
                putchar(10);
                iVar23 = 0;
                fflush((FILE *)0x0);
                free(prVar13);
                printf("%s %s: ","run_container_contains","run_cache_prefetch");
                fflush((FILE *)0x0);
                lVar24 = 0;
                do {
                  lVar14 = cpuid(0x80000006);
                  if (0 < prVar5->n_runs) {
                    uVar12 = 0;
                    do {
                      uVar12 = uVar12 + (*(uint *)(lVar14 + 0xc) >> 1 & 0x7f);
                    } while (uVar12 < (ulong)(uint)prVar5->n_runs * 2);
                  }
                  clock_gettime(3,&local_78);
                  iVar15 = (int)local_78.tv_nsec;
                  iVar21 = (int)local_78.tv_sec;
                  clock_gettime(3,&local_78);
                  iVar23 = ((int)local_78.tv_sec - iVar21) * 1000000000 +
                           iVar23 + ((int)local_78.tv_nsec - iVar15);
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 0x400);
                printf(" %.2f cycles per operation",(double)((float)iVar23 * 0.0009765625));
                putchar(10);
                iVar23 = 0;
                fflush((FILE *)0x0);
                printf("%s %s: ","run_container_contains","run_cache_flush");
                fflush((FILE *)0x0);
                lVar24 = 0;
                do {
                  lVar14 = cpuid(0x80000006);
                  if (0 < prVar5->n_runs) {
                    uVar4 = *(uint *)(lVar14 + 0xc) >> 1 & 0x7f;
                    lVar14 = 0;
                    iVar21 = 0;
                    do {
                      clflush(*(undefined1 *)((long)&prVar5->runs->value + lVar14));
                      iVar21 = iVar21 + uVar4;
                      lVar14 = lVar14 + (ulong)(uVar4 * 4);
                    } while (iVar21 < prVar5->n_runs * 2);
                  }
                  clock_gettime(3,&local_78);
                  iVar15 = (int)local_78.tv_nsec;
                  iVar21 = (int)local_78.tv_sec;
                  clock_gettime(3,&local_78);
                  iVar23 = ((int)local_78.tv_sec - iVar21) * 1000000000 +
                           iVar23 + ((int)local_78.tv_nsec - iVar15);
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 0x400);
                printf(" %.2f cycles per operation",(double)((float)iVar23 * 0.0009765625));
                putchar(10);
                fflush((FILE *)0x0);
                run_container_free(prVar5);
                uVar12 = (ulong)((uint)local_50 * 8);
              } while ((uint)local_50 < 0x2001);
              putchar(10);
              uVar4 = 0xfffffffd;
              local_68 = run_container_create();
              do {
                uVar4 = uVar4 + 3;
                run_container_add(local_68,(uint16_t)uVar4);
              } while (uVar4 < 0xfffd);
              uVar4 = 0xfffffffb;
              prVar5 = run_container_create();
              do {
                uVar4 = uVar4 + 5;
                run_container_add(prVar5,(uint16_t)uVar4);
              } while (uVar4 < 0xfffb);
              prVar8 = run_container_create();
              puts("\nUnion and intersections...");
              puts("\nNote:");
              puts("union times are expressed in cycles per number of input elements (both runs)");
              puts("intersection times are expressed in cycles per number of output elements\n");
              puts("==intersection and union test 1 ");
              prVar13 = local_68;
              uVar4 = run_container_cardinality(local_68);
              uVar20 = run_container_cardinality(prVar5);
              bVar25 = false;
              printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar4,
                     (ulong)uVar20);
              run_container_union(prVar13,prVar5,prVar8);
              local_50 = prVar8;
              uVar4 = run_container_cardinality(prVar8);
              local_48 = CONCAT44(local_48._4_4_,uVar4);
              printf("union cardinality = %d \n",(ulong)uVar4);
              uVar4 = run_container_cardinality(prVar13);
              uVar20 = run_container_cardinality(prVar5);
              printf("B1 card = %d B2 card = %d \n",(ulong)uVar4,(ulong)uVar20);
              local_38 = (long)prVar13->n_runs;
              local_40 = (long)prVar5->n_runs;
              printf("%s: ","union_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              prVar13 = local_50;
              iVar23 = 500;
              uVar12 = 0xffffffffffffffff;
              local_60 = prVar5;
              do {
                clock_gettime(3,&local_78);
                lVar24 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                local_58 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_union(local_68,local_60,prVar13);
                iVar21 = run_container_cardinality(prVar13);
                if (iVar21 != (int)local_48) {
                  bVar25 = true;
                }
                clock_gettime(3,&local_78);
                prVar8 = local_50;
                prVar5 = local_60;
                uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar24) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - local_58);
                if (uVar12 <= uVar6) {
                  uVar6 = uVar12;
                }
                iVar23 = iVar23 + -1;
                uVar12 = uVar6;
              } while (iVar23 != 0);
              printf(" %.2f cycles per operation",
                     (double)((float)uVar6 / (float)(ulong)(local_40 + local_38)));
              if (bVar25) {
                printf(" [ERROR]");
              }
              putchar(10);
              bVar25 = false;
              fflush((FILE *)0x0);
              run_container_intersection(local_68,prVar5,prVar8);
              uVar4 = run_container_cardinality(prVar8);
              local_58 = CONCAT44(extraout_var_00,uVar4);
              printf("intersection cardinality = %d \n",(ulong)uVar4);
              printf("%s: ","intersection_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              prVar5 = local_50;
              iVar23 = 500;
              uVar12 = 0xffffffffffffffff;
              do {
                clock_gettime(3,&local_78);
                lVar24 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_intersection(local_68,local_60,prVar5);
                iVar21 = run_container_cardinality(prVar5);
                if (iVar21 != (int)local_58) {
                  bVar25 = true;
                }
                clock_gettime(3,&local_78);
                prVar13 = local_60;
                uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar24) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
                if (uVar12 <= uVar6) {
                  uVar6 = uVar12;
                }
                iVar23 = iVar23 + -1;
                uVar12 = uVar6;
              } while (iVar23 != 0);
              uVar4 = (uint)local_58;
              if ((long)(int)uVar4 < 0) {
                fVar26 = (float)((ulong)(uVar4 & 1) | (ulong)(long)(int)uVar4 >> 1);
                fVar26 = fVar26 + fVar26;
              }
              else {
                fVar26 = (float)(int)uVar4;
              }
              printf(" %.2f cycles per operation",(double)((float)uVar6 / fVar26));
              if (bVar25) {
                printf(" [ERROR]");
              }
              putchar(10);
              fflush((FILE *)0x0);
              puts("==intersection and union test 2 ");
              local_68->n_runs = 0;
              prVar13->n_runs = 0;
              uVar4 = 0;
              do {
                uVar20 = uVar4 + ((uVar4 & 0xffff) / 0xb) * -0xb;
                if ((short)uVar20 != 0) {
                  uVar10 = 0;
                  do {
                    run_container_add(local_68,(short)uVar4 + (short)uVar10);
                    uVar10 = uVar10 + 1;
                  } while (uVar10 < (uVar20 & 0xffff));
                }
                bVar25 = uVar4 < 0xffc0;
                uVar4 = uVar4 + 0x40;
              } while (bVar25);
              iVar23 = 1;
              do {
                run_container_add(prVar13,(uint16_t)iVar23);
                prVar5 = local_68;
                bVar25 = iVar23 < 0x8000;
                iVar23 = iVar23 * 2;
              } while (bVar25);
              uVar4 = run_container_cardinality(local_68);
              uVar20 = run_container_cardinality(prVar13);
              bVar25 = false;
              printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar4,
                     (ulong)uVar20);
              prVar8 = local_50;
              run_container_union(prVar5,prVar13,local_50);
              uVar4 = run_container_cardinality(prVar8);
              local_58 = CONCAT44(local_58._4_4_,uVar4);
              printf("union cardinality = %d \n",(ulong)uVar4);
              uVar4 = run_container_cardinality(prVar5);
              uVar20 = run_container_cardinality(prVar13);
              printf("B1 card = %d B2 card = %d \n",(ulong)uVar4,(ulong)uVar20);
              local_40 = (long)prVar5->n_runs;
              local_48 = (long)prVar13->n_runs;
              printf("%s: ","union_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              iVar23 = 500;
              uVar12 = 0xffffffffffffffff;
              do {
                clock_gettime(3,&local_78);
                prVar5 = local_50;
                lVar24 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_union(local_68,local_60,local_50);
                iVar21 = run_container_cardinality(prVar5);
                if (iVar21 != (int)local_58) {
                  bVar25 = true;
                }
                clock_gettime(3,&local_78);
                prVar13 = local_50;
                prVar5 = local_60;
                uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar24) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
                if (uVar12 <= uVar6) {
                  uVar6 = uVar12;
                }
                iVar23 = iVar23 + -1;
                uVar12 = uVar6;
              } while (iVar23 != 0);
              printf(" %.2f cycles per operation",
                     (double)((float)uVar6 / (float)(ulong)(local_48 + local_40)));
              if (bVar25) {
                printf(" [ERROR]");
              }
              putchar(10);
              bVar25 = false;
              fflush((FILE *)0x0);
              run_container_intersection(local_68,prVar5,prVar13);
              uVar4 = run_container_cardinality(prVar13);
              local_58 = CONCAT44(extraout_var_01,uVar4);
              printf("intersection cardinality = %d \n",(ulong)uVar4);
              printf("%s: ","intersection_test(B1, B2, BO)");
              fflush((FILE *)0x0);
              prVar5 = local_50;
              iVar23 = 500;
              uVar12 = 0xffffffffffffffff;
              do {
                clock_gettime(3,&local_78);
                lVar24 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
                lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
                run_container_intersection(local_68,local_60,prVar5);
                iVar21 = run_container_cardinality(prVar5);
                if (iVar21 != (int)local_58) {
                  bVar25 = true;
                }
                clock_gettime(3,&local_78);
                prVar13 = local_60;
                uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar24) * 1000000000
                        + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
                if (uVar12 <= uVar6) {
                  uVar6 = uVar12;
                }
                iVar23 = iVar23 + -1;
                uVar12 = uVar6;
              } while (iVar23 != 0);
              uVar4 = (uint)local_58;
              if ((long)(int)uVar4 < 0) {
                fVar26 = (float)((ulong)(uVar4 & 1) | (ulong)(long)(int)uVar4 >> 1);
                fVar26 = fVar26 + fVar26;
              }
              else {
                fVar26 = (float)(int)uVar4;
              }
              printf(" %.2f cycles per operation",(double)((float)uVar6 / fVar26));
              if (bVar25) {
                printf(" [ERROR]");
              }
              putchar(10);
              fflush((FILE *)0x0);
              run_container_free(local_68);
              run_container_free(prVar13);
              run_container_free(local_50);
              return 0;
            }
          } while( true );
        }
      } while( true );
    }
  } while( true );
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }
    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}